

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcg64_shift.hpp
# Opt level: O3

result_type_conflict1 __thiscall
trng::beta_dist<float>::operator()(beta_dist<float> *this,lcg64_shift *r)

{
  ulong uVar1;
  ulong uVar2;
  float fVar3;
  
  uVar1 = (r->S).r * (r->P).a + (r->P).b;
  uVar2 = uVar1 >> 0x11 ^ uVar1;
  uVar2 = uVar2 << 0x1f ^ uVar2;
  (r->S).r = uVar1;
  fVar3 = math::detail::inv_Beta_I<float>
                    ((float)(uVar2 >> 1 ^ uVar2 >> 9) * 1.0842019e-19 + 1.1920929e-07,
                     (this->P).alpha_,(this->P).beta_,(this->P).norm_);
  return fVar3;
}

Assistant:

TRNG_CUDA_ENABLE
  inline lcg64_shift::result_type lcg64_shift::operator()() {
    step();
    result_type t{S.r};
    t ^= (t >> 17u);
    t ^= (t << 31u);
    t ^= (t >> 8u);
    return t;
  }